

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O3

void __thiscall
TreeDecomposition::updateNeighborSchema
          (TreeDecomposition *this,TDNode *node,size_t originID,size_t newAttrID)

{
  _WordT *p_Var1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (node->_numOfNeighbors != 0) {
    uVar3 = newAttrID >> 6;
    uVar4 = 0;
    do {
      sVar2 = (node->_neighbors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4];
      if (sVar2 == originID) {
        if (99 < newAttrID) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",newAttrID,
                     100);
        }
        p_Var1 = (node->_neighborSchema->super__Base_bitset<2UL>)._M_w + uVar3;
        *p_Var1 = *p_Var1 | 1L << ((byte)newAttrID & 0x3f);
      }
      else {
        updateNeighborSchema
                  (this,(this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar2],node->_id,newAttrID);
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 2;
    } while (uVar4 < node->_numOfNeighbors);
  }
  return;
}

Assistant:

void TreeDecomposition::updateNeighborSchema(TDNode* node, size_t originID,
                                             size_t newAttrID)
{
    for (size_t c = 0; c < node->_numOfNeighbors; ++c)
    {        
        if (node->_neighbors[c] == originID)
            node->_neighborSchema[c].set(newAttrID);
        else
            updateNeighborSchema(getRelation(node->_neighbors[c]), node->_id, newAttrID);
    }
}